

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O2

void aiMaterial::CopyPropertyList(aiMaterial *pcDest,aiMaterial *pcSrc)

{
  aiMaterialProperty **ppaVar1;
  aiMaterialProperty *other;
  int iVar2;
  bool bVar3;
  uint i;
  aiMaterialProperty **ppaVar4;
  ulong uVar5;
  aiMaterialProperty *paVar6;
  char *__dest;
  uint q;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong local_40;
  
  if (pcDest == (aiMaterial *)0x0) {
    __assert_fail("__null != pcDest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,0x248,
                  "static void aiMaterial::CopyPropertyList(aiMaterial *, const aiMaterial *)");
  }
  if (pcSrc == (aiMaterial *)0x0) {
    __assert_fail("__null != pcSrc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,0x249,
                  "static void aiMaterial::CopyPropertyList(aiMaterial *, const aiMaterial *)");
  }
  uVar7 = pcDest->mNumProperties;
  uVar8 = (ulong)uVar7;
  uVar9 = pcDest->mNumAllocated + pcSrc->mNumAllocated;
  pcDest->mNumAllocated = uVar9;
  pcDest->mNumProperties = pcSrc->mNumProperties + uVar7;
  ppaVar1 = pcDest->mProperties;
  ppaVar4 = (aiMaterialProperty **)operator_new__((ulong)uVar9 << 3);
  pcDest->mProperties = ppaVar4;
  if (ppaVar1 == (aiMaterialProperty **)0x0 || uVar8 == 0) {
    if (ppaVar1 == (aiMaterialProperty **)0x0) goto LAB_00134ae6;
  }
  else {
    for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      pcDest->mProperties[uVar5] = ppaVar1[uVar5];
    }
  }
  operator_delete__(ppaVar1);
LAB_00134ae6:
  while (local_40 = (ulong)uVar7, uVar7 < pcDest->mNumProperties) {
    other = pcSrc->mProperties[local_40];
    iVar10 = 0;
    for (uVar5 = 0; iVar2 = (int)local_40, uVar8 != uVar5; uVar5 = uVar5 + 1) {
      paVar6 = pcDest->mProperties[uVar5];
      if ((((paVar6 != (aiMaterialProperty *)0x0) &&
           (bVar3 = aiString::operator==(&paVar6->mKey,&other->mKey), bVar3)) &&
          (paVar6->mSemantic == other->mSemantic)) && (paVar6->mIndex == other->mIndex)) {
        aiMaterialProperty::~aiMaterialProperty(paVar6);
        operator_delete(paVar6);
        memmove(pcDest->mProperties + uVar5,pcDest->mProperties + uVar5 + 1,
                (ulong)(uint)(iVar2 + iVar10));
        local_40 = (ulong)(iVar2 - 1);
        pcDest->mNumProperties = pcDest->mNumProperties - 1;
      }
      iVar10 = iVar10 + -1;
    }
    paVar6 = (aiMaterialProperty *)operator_new(0x420);
    aiMaterialProperty::aiMaterialProperty(paVar6);
    pcDest->mProperties[local_40] = paVar6;
    if (paVar6 != other) {
      uVar7 = (other->mKey).length;
      (paVar6->mKey).length = uVar7;
      memcpy((paVar6->mKey).data,(other->mKey).data,(ulong)uVar7);
      (paVar6->mKey).data[uVar7] = '\0';
    }
    uVar7 = other->mDataLength;
    paVar6->mDataLength = uVar7;
    paVar6->mType = other->mType;
    paVar6->mSemantic = other->mSemantic;
    paVar6->mIndex = other->mIndex;
    __dest = (char *)operator_new__((ulong)other->mDataLength);
    paVar6->mData = __dest;
    memcpy(__dest,other->mData,(ulong)uVar7);
    uVar7 = iVar2 + 1;
  }
  return;
}

Assistant:

void aiMaterial::CopyPropertyList(aiMaterial* pcDest,
    const aiMaterial* pcSrc
    )
{
    ai_assert(NULL != pcDest);
    ai_assert(NULL != pcSrc);

    unsigned int iOldNum = pcDest->mNumProperties;
    pcDest->mNumAllocated += pcSrc->mNumAllocated;
    pcDest->mNumProperties += pcSrc->mNumProperties;

    aiMaterialProperty** pcOld = pcDest->mProperties;
    pcDest->mProperties = new aiMaterialProperty*[pcDest->mNumAllocated];

    if (iOldNum && pcOld)   {
        for (unsigned int i = 0; i < iOldNum;++i) {
            pcDest->mProperties[i] = pcOld[i];
        }
    }

    if ( pcOld ) {
        delete[] pcOld;
    }

    for (unsigned int i = iOldNum; i< pcDest->mNumProperties;++i)   {
        aiMaterialProperty* propSrc = pcSrc->mProperties[i];

        // search whether we have already a property with this name -> if yes, overwrite it
        aiMaterialProperty* prop;
        for ( unsigned int q = 0; q < iOldNum; ++q ) {
            prop = pcDest->mProperties[q];
            if (prop /* just for safety */ && prop->mKey == propSrc->mKey && prop->mSemantic == propSrc->mSemantic
                && prop->mIndex == propSrc->mIndex) {
                delete prop;

                // collapse the whole array ...
                memmove(&pcDest->mProperties[q],&pcDest->mProperties[q+1],i-q);
                i--;
                pcDest->mNumProperties--;
            }
        }

        // Allocate the output property and copy the source property
        prop = pcDest->mProperties[i] = new aiMaterialProperty();
        prop->mKey = propSrc->mKey;
        prop->mDataLength = propSrc->mDataLength;
        prop->mType = propSrc->mType;
        prop->mSemantic = propSrc->mSemantic;
        prop->mIndex = propSrc->mIndex;

        prop->mData = new char[propSrc->mDataLength];
        memcpy(prop->mData,propSrc->mData,prop->mDataLength);
    }
}